

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void google::protobuf::internal::PackedFieldHelper<2>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  float fVar1;
  float *pfVar2;
  RepeatedField<float> *array;
  int index;
  undefined4 local_30;
  uint32 local_2c;
  
  if (*field != 0) {
    local_2c = md->tag;
    PrimitiveTypeHelper<13>::Serialize(&local_2c,output);
    local_30 = *(undefined4 *)((long)field + 0x10);
    PrimitiveTypeHelper<13>::Serialize(&local_30,output);
    if (0 < *field) {
      index = 0;
      do {
        pfVar2 = RepeatedField<float>::Get((RepeatedField<float> *)field,index);
        fVar1 = *pfVar2;
        pfVar2 = (float *)output->cur_;
        if ((output->impl_).end_ <= pfVar2) {
          pfVar2 = (float *)io::EpsCopyOutputStream::EnsureSpaceFallback
                                      (&output->impl_,(uint8 *)pfVar2);
        }
        *pfVar2 = fVar1;
        output->cur_ = (uint8 *)(pfVar2 + 1);
        index = index + 1;
      } while (index < *field);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}